

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
I2sSimulationDataGenerator::WriteBit(I2sSimulationDataGenerator *this,BitState data,BitState frame)

{
  uint uVar1;
  
  uVar1 = (int)this + 0x10;
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mFrame);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  return;
}

Assistant:

inline void I2sSimulationDataGenerator::WriteBit( BitState data, BitState frame )
{
    // start 'low', pause 1/2 period:
    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );

    //'posedge' on clock, write update data lines:
    mClock->Transition();

    mFrame->TransitionIfNeeded( frame );

    mData->TransitionIfNeeded( data );

    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );

    //'negedge' on clock, data is valid.
    mClock->Transition();
}